

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O2

int onig_new(regex_t **reg,OnigUChar *pattern,OnigUChar *pattern_end,OnigOptionType option,
            OnigEncoding enc,OnigSyntaxType *syntax,OnigErrorInfo *einfo)

{
  int iVar1;
  regex_t *reg_00;
  
  reg_00 = (regex_t *)malloc(0x1c8);
  *reg = reg_00;
  if (reg_00 == (regex_t *)0x0) {
    iVar1 = -5;
  }
  else {
    iVar1 = onig_reg_init(reg_00,option,OnigDefaultCaseFoldFlag,enc,syntax);
    if (iVar1 == 0) {
      iVar1 = onig_compile(*reg,pattern,pattern_end,einfo);
      if (iVar1 == 0) {
        return 0;
      }
      onig_free(*reg);
    }
    else {
      free(*reg);
    }
    *reg = (regex_t *)0x0;
  }
  return iVar1;
}

Assistant:

extern int
onig_new(regex_t** reg, const UChar* pattern, const UChar* pattern_end,
         OnigOptionType option, OnigEncoding enc, OnigSyntaxType* syntax,
         OnigErrorInfo* einfo)
{
  int r;

  *reg = (regex_t* )xmalloc(sizeof(regex_t));
  if (IS_NULL(*reg)) return ONIGERR_MEMORY;

  r = onig_reg_init(*reg, option, ONIGENC_CASE_FOLD_DEFAULT, enc, syntax);
  if (r != 0) {
    xfree(*reg);
    *reg = NULL;
    return r;
  }

  r = onig_compile(*reg, pattern, pattern_end, einfo);
  if (r != 0) {
    onig_free(*reg);
    *reg = NULL;
  }
  return r;
}